

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse_Args.cpp
# Opt level: O2

int Nova::Parse_Args::Find_And_Remove_Integer(char *str,int *argc,char **argv)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  uVar1 = *argc;
  lVar5 = (long)(int)uVar1;
  uVar4 = 0;
  uVar6 = 0;
  if (0 < (int)uVar1) {
    uVar6 = (ulong)uVar1;
  }
  do {
    if (uVar6 == uVar4) {
LAB_0012f7f9:
      uVar3 = (int)uVar6 + 1;
      iVar2 = 0;
      if ((int)uVar3 < (int)uVar1) {
        iVar2 = atoi(argv[uVar3]);
        for (; (long)uVar6 < lVar5 + -2; uVar6 = uVar6 + 1) {
          argv[uVar6] = argv[uVar6 + 2];
        }
        argv[lVar5 + -1] = (char *)0x0;
        *argc = (int)(lVar5 + -2);
        argv[lVar5 + -2] = (char *)0x0;
      }
      return iVar2;
    }
    iVar2 = strcmp(str,argv[uVar4]);
    if (iVar2 == 0) {
      uVar6 = uVar4 & 0xffffffff;
      goto LAB_0012f7f9;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

int Parse_Args::
Find_And_Remove_Integer(const char *str,int& argc,char** argv)
{
    int value,i;
    for(i=0;i<argc;i++) if(!strcmp(str,argv[i])) break;
    if(i+1<argc)
    {
        value=atoi(argv[i+1]);
        for(;i<argc-2;i++) argv[i]=argv[i+2];
        argc--;
        argv[argc]=0;
        argc--;
        argv[argc]=0;
        return value;
    }
    return 0;
}